

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_SetOutAsmInt
          (InterpreterStackFrame *this,RegSlot outRegisterID,int val)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int val_local;
  RegSlot outRegisterID_local;
  InterpreterStackFrame *this_local;
  Var local_10;
  
  if (*(ulong *)(this + 0x30) <= *(long *)(this + 0x28) + (ulong)outRegisterID * 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x94c,"(m_outParams + outRegisterID < m_outSp)",
                                "m_outParams + outRegisterID < m_outSp");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext = *(ScriptContext **)(this + 0x78);
  bVar2 = TaggedInt::IsOverflow(val);
  if (bVar2) {
    local_10 = JavascriptNumber::NewInlined((double)val,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(val);
  }
  *(Var *)(*(long *)(this + 0x28) + (ulong)outRegisterID * 8) = local_10;
  return;
}

Assistant:

inline void InterpreterStackFrame::OP_SetOutAsmInt(RegSlot outRegisterID, int val)
    {
        Assert(m_outParams + outRegisterID < m_outSp);
        m_outParams[outRegisterID] = JavascriptNumber::ToVar(val, scriptContext);
    }